

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

bool __thiscall soul::AST::TypeMetaFunction::isResolved(TypeMetaFunction *this)

{
  Expression *pEVar1;
  bool bVar2;
  int iVar3;
  Type TStack_28;
  
  pEVar1 = (this->source).object;
  if ((pEVar1->kind == value) &&
     (iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar3 != '\0'
     )) {
    (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&TStack_28);
    bVar2 = checkSourceType(this,&TStack_28);
    RefCountedPtr<soul::Structure>::decIfNotNull(TStack_28.structure.object);
    return bVar2;
  }
  pEVar1 = (this->source).object;
  if ((pEVar1->kind == type) &&
     (iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar3 != '\0'
     )) {
    (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&TStack_28);
    bVar2 = checkSourceType(this,&TStack_28);
    RefCountedPtr<soul::Structure>::decIfNotNull(TStack_28.structure.object);
    return bVar2;
  }
  pEVar1 = (this->source).object;
  if ((pEVar1->kind == endpoint) &&
     (iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar3 != '\0'
     )) {
    return this->operation == sourceType;
  }
  return false;
}

Assistant:

bool isResolved() const override
        {
            if (isResolvedAsValue (source.get()))      return checkSourceType (source->getResultType());
            if (isResolvedAsType (source.get()))       return checkSourceType (source->resolveAsType());
            if (isResolvedAsEndpoint (source.get()))   return operation == Op::sourceType;

            return false;
        }